

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O1

RunnerContext * RunBinary(Runner *runner)

{
  Token op;
  ASTNode *pAVar1;
  ASTNode *pAVar2;
  RunnerContext *pRVar3;
  RunnerContext *right;
  
  pAVar1 = runner->currentNode;
  pAVar2 = (pAVar1->meta).binaryExpr.right;
  op = (pAVar1->meta).binaryExpr.op;
  pRVar3 = SetNodeValue(runner,(pAVar1->meta).binaryExpr.left);
  runner->currentNode = pAVar2;
  right = RunStatement(runner);
  pRVar3 = RunMathContexts(pRVar3,right,op);
  return pRVar3;
}

Assistant:

RunnerContext* RunBinary(Runner* runner){
  DEBUG_PRINT_RUNNER("Binary expression")
  ASTNode* binary = runner->currentNode;
  ASTNode* left = GET_BIN_LEFT(binary);
  ASTNode* right = GET_BIN_RIGHT(binary);
  Token op = GET_BIN_OP(binary);

  RunnerContext* leftContext = SetNodeValue(runner, left);
  runner->currentNode = right;
  RunnerContext* rightContext = RunStatement(runner);

  return RunMathContexts(leftContext, rightContext, op);
}